

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseBuilder::newInstNode
          (BaseBuilder *this,InstNode **out,InstId instId,InstOptions instOptions,uint32_t opCount)

{
  Error EVar1;
  InstNode *pIVar2;
  int iVar3;
  
  iVar3 = (uint)(4 < opCount) * 2 + 4;
  pIVar2 = (InstNode *)ZoneAllocator::alloc(&this->_allocator,(ulong)(iVar3 * 0x10 + 0x40));
  if (pIVar2 != (InstNode *)0x0) {
    *(undefined8 *)pIVar2 = 0;
    *(undefined8 *)(pIVar2 + 8) = 0;
    pIVar2[0x10] = (InstNode)0x1;
    pIVar2[0x11] = (InstNode)(this->_nodeFlags | (kActsAsInst|kIsRemovable|kIsCode));
    *(undefined8 *)(pIVar2 + 0x14) = 0;
    *(undefined8 *)(pIVar2 + 0x1c) = 0;
    *(undefined8 *)(pIVar2 + 0x20) = 0;
    *(undefined8 *)(pIVar2 + 0x28) = 0;
    *(InstId *)(pIVar2 + 0x30) = instId;
    *(InstOptions *)(pIVar2 + 0x34) = instOptions;
    *(undefined8 *)(pIVar2 + 0x38) = 0;
    pIVar2[0x13] = SUB41(iVar3,0);
    pIVar2[0x12] = SUB41(opCount,0);
    *out = pIVar2;
    return 0;
  }
  EVar1 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  return EVar1;
}

Assistant:

Error BaseBuilder::newInstNode(InstNode** out, InstId instId, InstOptions instOptions, uint32_t opCount) {
  uint32_t opCapacity = InstNode::capacityOfOpCount(opCount);
  ASMJIT_ASSERT(opCapacity >= InstNode::kBaseOpCapacity);

  InstNode* node = _allocator.allocT<InstNode>(InstNode::nodeSizeOfOpCapacity(opCapacity));
  if (ASMJIT_UNLIKELY(!node))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  *out = new(Support::PlacementNew{node}) InstNode(this, instId, instOptions, opCount, opCapacity);
  return kErrorOk;
}